

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

bool __thiscall vkb::detail::VulkanFunctions::load_vulkan_library(VulkanFunctions *this)

{
  void *pvVar1;
  PFN_vkGetInstanceProcAddr p_Var2;
  
  if (this->library != (void *)0x0) {
    return true;
  }
  pvVar1 = (void *)dlopen("libvulkan.so.1",2);
  this->library = pvVar1;
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)dlopen("libvulkan.so",2);
    this->library = pvVar1;
    if (pvVar1 == (void *)0x0) {
      return false;
    }
  }
  p_Var2 = (PFN_vkGetInstanceProcAddr)dlsym(pvVar1,"vkGetInstanceProcAddr");
  this->ptr_vkGetInstanceProcAddr = p_Var2;
  return p_Var2 != (PFN_vkGetInstanceProcAddr)0x0;
}

Assistant:

bool load_vulkan_library() {
        // Can immediately return if it has already been loaded
        if (library) {
            return true;
        }
#if defined(__linux__) || defined(__FreeBSD__)
        library = dlopen("libvulkan.so.1", RTLD_NOW | RTLD_LOCAL);
        if (!library) library = dlopen("libvulkan.so", RTLD_NOW | RTLD_LOCAL);
#elif defined(__APPLE__)
        library = dlopen("libvulkan.dylib", RTLD_NOW | RTLD_LOCAL);
        if (!library) library = dlopen("libvulkan.1.dylib", RTLD_NOW | RTLD_LOCAL);
        if (!library) library = dlopen("libMoltenVK.dylib", RTLD_NOW | RTLD_LOCAL);
#elif defined(_WIN32)
        library = LoadLibrary(TEXT("vulkan-1.dll"));
#else
        assert(false && "Unsupported platform");
#endif
        if (!library) return false;
        load_func(ptr_vkGetInstanceProcAddr, "vkGetInstanceProcAddr");
        return ptr_vkGetInstanceProcAddr != nullptr;
    }